

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSortBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,OrderType *order,OrderByNullType *null_order)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  element_type *peVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  reference pvVar7;
  pointer pEVar8;
  reference pvVar9;
  ListSortBindData *this_00;
  LogicalType *pLVar10;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> extraout_RAX;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LogicalType child_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  undefined8 local_88;
  _Alloc_hider _Stack_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  LogicalType local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_70._M_allocated_capacity = (size_type)this;
  local_70._8_8_ = null_order;
  LogicalType::LogicalType(&local_60);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
  bVar6 = LogicalType::operator==(&pEVar8->return_type,(LogicalType *)&local_90);
  LogicalType::~LogicalType((LogicalType *)&local_90);
  if (bVar6) {
    LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    _Var5._M_p = _Stack_80._M_p;
    peVar3 = local_88;
    pvVar9->id_ = (LogicalTypeId)local_90._M_head_impl;
    pvVar9->physical_type_ = local_90._M_head_impl._1_1_;
    uVar11 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar13 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar14 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88 = (element_type *)0x0;
    _Stack_80._M_p = (pointer)0x0;
    p_Var1 = (pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48 = uVar11;
      uStack_44 = uVar12;
      uStack_40 = uVar13;
      uStack_3c = uVar14;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar11 = local_48;
      uVar12 = uStack_44;
      uVar13 = uStack_40;
      uVar14 = uStack_3c;
    }
    _Var5._M_p = _Stack_80._M_p;
    local_88 = (element_type *)CONCAT44(uVar12,uVar11);
    _Stack_80._M_p._4_4_ = uVar14;
    _Stack_80._M_p._0_4_ = uVar13;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)&local_90);
    LogicalType::LogicalType((LogicalType *)&local_90,SQLNULL);
    pLVar10 = &(bound_function->super_BaseScalarFunction).return_type;
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_90._M_head_impl;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_90._M_head_impl._1_1_;
    peVar3 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_80._M_p;
    local_88 = peVar3;
    _Stack_80._M_p = (pointer)p_Var1;
    LogicalType::~LogicalType((LogicalType *)&local_90);
    if (&local_60 != pLVar10) {
      local_60.id_ = (bound_function->super_BaseScalarFunction).return_type.id_;
      local_60.physical_type_ =
           (bound_function->super_BaseScalarFunction).return_type.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_60.type_info_,
                 &(bound_function->super_BaseScalarFunction).return_type.type_info_);
    }
    this_00 = (ListSortBindData *)operator_new(0xf0);
    ListSortBindData::ListSortBindData
              (this_00,*order,*(OrderByNullType *)local_70._8_8_,false,pLVar10,&local_60,context);
  }
  else {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    local_78._M_head_impl =
         (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddArrayCastToList
              ((BoundCastExpression *)&local_90,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_78);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var4._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_90._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_90._M_head_impl + 8))();
    }
    local_90._M_head_impl = (Expression *)0x0;
    if (local_78._M_head_impl != (Expression *)0x0) {
      (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_78._M_head_impl = (Expression *)0x0;
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pLVar10 = ListType::GetChildType(&pEVar8->return_type);
    if (&local_60 != pLVar10) {
      local_60.id_ = pLVar10->id_;
      local_60.physical_type_ = pLVar10->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&local_60.type_info_,&pLVar10->type_info_);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    if (pvVar9 != &pEVar8->return_type) {
      pvVar9->id_ = (pEVar8->return_type).id_;
      pvVar9->physical_type_ = (pEVar8->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar9->type_info_,&(pEVar8->return_type).type_info_);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pLVar10 = &(bound_function->super_BaseScalarFunction).return_type;
    if (pLVar10 != &pEVar8->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar8->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar8->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar8->return_type).type_info_);
    }
    this_00 = (ListSortBindData *)operator_new(0xf0);
    ListSortBindData::ListSortBindData
              (this_00,*order,*(OrderByNullType *)local_70._8_8_,false,pLVar10,&local_60,context);
  }
  *(ListSortBindData **)local_70._M_allocated_capacity = this_00;
  LogicalType::~LogicalType(&local_60);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>)
         extraout_RAX.
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListSortBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments, OrderType &order,
                                             OrderByNullType &null_order) {

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		child_type = bound_function.return_type;
		return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	child_type = ListType::GetChildType(arguments[0]->return_type);

	bound_function.arguments[0] = arguments[0]->return_type;
	bound_function.return_type = arguments[0]->return_type;

	return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
}